

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O3

int av1_optimize_txb(AV1_COMP *cpi,MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type
                    ,TXB_CTX *txb_ctx,int *rate_cost,int sharpness)

{
  CommonQuantParams *quant_params;
  short sVar1;
  MB_MODE_INFO *pMVar2;
  byte bVar3;
  bool bVar4;
  MACROBLOCKD *xd;
  byte bVar5;
  uint8_t uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  undefined4 extraout_var;
  long lVar14;
  int (*paiVar15) [26];
  uint8_t *puVar16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  int16_t *scan;
  int col_11;
  ulong uVar25;
  qm_val_t *iqmatrix;
  int iVar26;
  int iVar27;
  ulong uVar28;
  TX_TYPE tx_type_00;
  int iVar29;
  int iVar30;
  undefined7 in_register_00000081;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  undefined7 in_register_00000089;
  int *piVar34;
  uint uVar35;
  long lVar36;
  undefined8 uVar37;
  int iVar38;
  LV_MAP_EOB_COST *pLVar39;
  int col_10;
  tran_low_t *qcoeff;
  int col_13;
  uint uVar40;
  ulong uVar41;
  long lVar42;
  int (*paiVar43) [26];
  tran_low_t *ptVar44;
  uint uVar45;
  uint uVar46;
  bool bVar47;
  uint local_72c;
  int (*local_728) [26];
  undefined8 local_720;
  int (*local_718) [26];
  undefined8 local_710;
  int (*local_708) [26];
  uint8_t *local_700;
  tran_low_t *local_6f8;
  int col_2;
  tran_low_t *local_6e8;
  long local_6e0;
  int col;
  undefined4 uStack_6d4;
  ulong local_6d0;
  LV_MAP_COEFF_COST *local_6c8;
  undefined8 local_6c0;
  qm_val_t *local_6b8;
  ulong local_6b0;
  long local_6a8;
  ulong local_6a0;
  MACROBLOCKD *local_698;
  ulong local_690;
  qm_val_t *local_688;
  int (*local_680) [26];
  int (*local_678) [8];
  int (*local_670) [26];
  ulong local_668;
  ulong local_660;
  LV_MAP_EOB_COST *local_658;
  int16_t *local_650;
  ulong local_648;
  int (*local_640) [2];
  int (*local_638) [26];
  tran_low_t *local_630;
  int (*local_628) [26];
  uint local_620;
  int local_61c;
  int (*local_618) [3];
  int (*local_610) [26];
  int (*local_608) [26];
  int16_t *local_600;
  int *local_5f8;
  int (*local_5f0) [3];
  int (*local_5e8) [3];
  uint8_t *local_5e0;
  int nz_ci [3];
  int64_t dummy_dist;
  uint8_t levels_buf [1312];
  uint8_t *puVar13;
  
  iVar8 = (int)CONCAT71(in_register_00000089,tx_type);
  local_6f8 = (tran_low_t *)CONCAT44(local_6f8._4_4_,iVar8);
  local_698 = &x->e_mbd;
  local_6a0 = CONCAT71(in_register_00000081,tx_size) & 0xffffffff;
  uVar20 = (ulong)(uint)(iVar8 << 4);
  uVar7 = (int)CONCAT71(in_register_00000081,tx_size) << 8;
  local_650 = *(int16_t **)((long)&av1_scan_orders[0][0].scan + uVar20 + uVar7);
  local_61c = plane;
  iVar8 = av1_get_tx_scale(tx_size);
  xd = local_698;
  ptVar44 = local_6f8;
  local_6c0 = CONCAT44(extraout_var,iVar8);
  local_6d0 = CONCAT44(local_6d0._4_4_,block);
  local_600 = x->plane[plane].dequant_QTX;
  local_6b0 = (ulong)x->plane[plane].eobs[block];
  quant_params = &(cpi->common).quant_params;
  tx_type_00 = (TX_TYPE)local_6f8;
  local_6b8 = av1_get_iqmatrix(quant_params,local_698,plane,tx_size,tx_type_00);
  uVar9 = (uint)tx_size;
  if ((cpi->oxcf).tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR) {
    local_688 = av1_get_qmatrix(quant_params,xd,local_61c,tx_size,tx_type_00);
  }
  else {
    local_688 = (qm_val_t *)0x0;
  }
  scan = local_650;
  iVar8 = (int)local_6d0 << 4;
  pMVar2 = *(x->e_mbd).mi;
  uVar41 = 10;
  local_648 = 0x20;
  uVar45 = (uint)tx_size;
  if (uVar9 < 0x11) {
    uVar31 = 3;
    if ((1 < uVar45 - 0xb) && (uVar45 != 4)) {
LAB_0036f00d:
      uVar31 = local_6a0;
    }
    uVar31 = (ulong)(uint)tx_size_high_log2[uVar31];
    if (uVar9 < 0x11) {
      uVar28 = 3;
      if ((1 < uVar9 - 0xb) && (uVar45 != 4)) {
        uVar28 = local_6a0;
      }
    }
    else {
      if (uVar9 == 0x11) goto LAB_0036f089;
      uVar28 = local_6a0;
      if (uVar45 == 0x12) goto LAB_0036f0ba;
    }
    local_648 = (ulong)(uint)tx_size_wide[uVar28];
    if (uVar9 < 0x11) {
      uVar41 = 3;
      if ((1 < uVar45 - 0xb) && (uVar9 != 4)) {
LAB_0036f0aa:
        uVar41 = local_6a0;
      }
    }
    else if (uVar9 == 0x11) {
      uVar41 = 9;
    }
    else if (uVar9 != 0x12) goto LAB_0036f0aa;
  }
  else {
    uVar31 = 5;
    if (uVar9 == 0x11) {
LAB_0036f089:
      uVar41 = 9;
      local_648 = 0x10;
    }
    else {
      uVar31 = 4;
      if (uVar45 != 0x12) goto LAB_0036f00d;
    }
  }
LAB_0036f0ba:
  uVar28 = 1;
  if ((pMVar2->field_0xa7 & 0x80) == 0) {
    uVar28 = (ulong)('\0' < pMVar2->ref_frame[0]);
  }
  qcoeff = x->plane[plane].qcoeff + iVar8;
  local_6e8 = x->plane[plane].dqcoeff + iVar8;
  local_630 = x->plane[plane].coeff + iVar8;
  bVar17 = ""[(ulong)ptVar44 & 0xffffffff];
  bVar47 = local_61c != 0;
  local_6c8 = (x->coeff_costs).coeff_costs
              [(uint)""[local_6a0] + (uint)""[local_6a0] + 1 >> 1 & 0xff] + bVar47;
  local_658 = (x->coeff_costs).eob_costs[""[local_6a0]] + bVar47;
  bVar5 = (((cpi->oxcf).tune_cfg.tuning & ~AOM_TUNE_SSIM) == AOM_TUNE_IQ) * '\x02' | 5;
  local_6e0 = (long)((ulong)((uint)(1 << bVar5) >> 1) +
                    (long)(plane_rd_mult[uVar28][bVar47] <<
                          ((char)(x->e_mbd).bd * '\x02' - 0x10U & 0x1f)) *
                    (long)(8 - sharpness) * (long)x->rdmult) >> bVar5;
  if (1 < (ushort)local_6b0) {
    (*av1_txb_init_levels)(qcoeff,(int)local_648,tx_size_high[uVar41],levels_buf);
  }
  uVar41 = local_6b0;
  iVar8 = local_6c8->txb_skip_cost[txb_ctx->txb_skip_ctx][0];
  iVar12 = local_6c8->txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  iVar18 = (int)local_6b0;
  local_72c = get_eob_cost(iVar18,local_658,local_6c8,bVar17);
  iqmatrix = local_6b8;
  local_628 = (int (*) [26])0x0;
  sVar1 = scan[uVar41 - 1];
  uVar9 = qcoeff[sVar1];
  uVar45 = -uVar9;
  if (0 < (int)uVar9) {
    uVar45 = uVar9;
  }
  iVar22 = iVar18 + -1;
  nz_ci[0] = (int)sVar1;
  nz_ci[1] = 0;
  nz_ci[2] = 0;
  bVar5 = (byte)uVar31;
  iVar23 = (int)local_648;
  local_620 = (uint)bVar17;
  if (uVar45 < 2) {
    if (iVar22 == 0) {
      uVar41 = 0;
    }
    else {
      bVar3 = bVar5 & 0x1f;
      iVar38 = iVar23 << bVar3;
      iVar18 = iVar38 + 7;
      if (-1 < iVar23 << bVar3) {
        iVar18 = iVar38;
      }
      uVar41 = 1;
      if (iVar18 >> 3 < iVar22) {
        iVar18 = iVar38 + 3;
        if (-1 < iVar23 << bVar3) {
          iVar18 = iVar38;
        }
        uVar41 = (ulong)(iVar18 >> 2 < iVar22) | 2;
      }
    }
    iVar18 = local_6c8->base_eob_cost[uVar41 - 1][(long)(int)uVar45 + 2];
    if (uVar9 != 0) {
      if (sVar1 == 0) {
        iVar18 = iVar18 + local_6c8->dc_sign_cost[txb_ctx->dc_sign_ctx][uVar9 >> 0x1f];
      }
      else {
        iVar18 = iVar18 + 0x200;
      }
    }
    local_72c = iVar18 + local_72c;
    iVar18 = local_630[sVar1];
    bVar3 = (byte)local_6c0;
    lVar24 = (long)(iVar18 - local_6e8[sVar1] << (bVar3 & 0x1f));
    if (local_688 == (qm_val_t *)0x0) {
      uVar41 = lVar24 * lVar24;
      lVar24 = (long)(iVar18 << (bVar3 & 0x1f));
      uVar28 = lVar24 * lVar24;
    }
    else {
      lVar24 = lVar24 * (ulong)local_688[sVar1];
      uVar41 = lVar24 * lVar24 + 0x200U >> 10;
      lVar24 = (long)(iVar18 << (bVar3 & 0x1f)) * (ulong)local_688[sVar1];
      uVar28 = lVar24 * lVar24 + 0x200U >> 10;
    }
    local_628 = (int (*) [26])(uVar41 - uVar28);
    uVar41 = local_6b0;
  }
  else {
    update_coeff_general
              ((int *)&local_72c,(int64_t *)&local_628,iVar22,iVar18,tx_size,bVar17,(int)uVar31,
               iVar23,local_6e0,(int)local_6c0,txb_ctx->dc_sign_ctx,local_600,scan,local_6c8,
               local_630,qcoeff,local_6e8,levels_buf,local_6b8,local_688);
  }
  uVar9 = (int)uVar41 - 2;
  puVar13 = (uint8_t *)(ulong)uVar9;
  iVar18 = (int)local_648;
  uVar37 = local_6c0;
  ptVar44 = local_6e8;
  local_6f8 = qcoeff;
  local_6d0 = uVar31;
  if (bVar17 == 0) {
    uVar41 = (ulong)local_72c;
    uVar45 = 1;
    local_728 = local_628;
    if (1 < (ushort)local_6b0) {
      uVar45 = 1;
      local_680 = (int (*) [26])(long)(1 << (bVar5 & 0x1f));
      local_5f8 = *local_680 + 1;
      local_5f0 = (int (*) [3])(long)(2 << (bVar5 & 0x1f));
      local_618 = local_6c8->base_eob_cost;
      local_678 = local_6c8->base_cost;
      local_640 = local_6c8->dc_sign_cost;
      local_610 = local_6c8->lps_cost;
      iVar38 = iVar18 << (bVar5 & 0x1f);
      iVar23 = iVar38 + 3;
      iVar22 = iVar38 + 7;
      if (-1 < iVar18 << (bVar5 & 0x1f)) {
        iVar23 = iVar38;
        iVar22 = iVar38;
      }
      local_5e8 = (int (*) [3])(long)(iVar22 >> 3);
      do {
        sVar1 = scan[(long)puVar13];
        lVar24 = (long)sVar1;
        iVar18 = (int)local_600[lVar24 != 0];
        if (iqmatrix != (qm_val_t *)0x0) {
          iVar18 = (int)((uint)iqmatrix[lVar24] * iVar18 + 0x10) >> 5;
        }
        local_710 = (int (*) [26])CONCAT44(local_710._4_4_,iVar18);
        iVar22 = (int)sVar1;
        uVar9 = iVar22 >> ((byte)uVar31 & 0x1f);
        _col_2 = (int (*) [26])(ulong)uVar9;
        lVar14 = (long)(int)((int)sVar1 + uVar9 * 4);
        if (sVar1 == 0) {
          lVar42 = 0;
        }
        else {
          uVar11 = (uint)""[levels_buf[lVar14 + 2]] +
                   (uint)""[(levels_buf + lVar14 + 8)[(long)local_5f0]] +
                   (uint)""[(levels_buf + lVar14 + 5)[(long)local_680]] +
                   (uint)""[levels_buf[lVar14 + 1]] +
                   (uint)""[(levels_buf + lVar14)[(long)local_5f8]] + 1 >> 1;
          uVar28 = (ulong)uVar11;
          if (3 < uVar11) {
            uVar28 = 4;
          }
          lVar42 = uVar28 + (long)av1_nz_map_ctx_offset[local_6a0][lVar24];
        }
        uVar11 = qcoeff[lVar24];
        if (uVar11 == 0) {
          uVar41 = (ulong)(uint)((int)uVar41 + local_678[lVar42][0]);
          puVar16 = puVar13;
        }
        else {
          uVar10 = -uVar11;
          if (0 < (int)uVar11) {
            uVar10 = uVar11;
          }
          iVar38 = local_630[lVar24];
          bVar17 = (byte)uVar37;
          lVar36 = (long)(iVar38 << (bVar17 & 0x1f));
          if (local_688 == (qm_val_t *)0x0) {
            local_668 = lVar36 * lVar36;
            lVar36 = (long)(iVar38 - ptVar44[lVar24] << (bVar17 & 0x1f));
            uVar31 = lVar36 * lVar36;
          }
          else {
            lVar36 = lVar36 * (ulong)local_688[lVar24];
            local_668 = lVar36 * lVar36 + 0x200U >> 10;
            lVar36 = (long)(iVar38 - ptVar44[lVar24] << (bVar17 & 0x1f)) * (ulong)local_688[lVar24];
            uVar31 = lVar36 * lVar36 + 0x200U >> 10;
          }
          local_6a8 = (long)txb_ctx->dc_sign_ctx;
          uVar11 = (int)uVar11 >> 0x1f;
          uVar35 = -uVar11;
          local_718 = (int (*) [26])(ulong)uVar35;
          uVar28 = 3;
          if (uVar10 < 3) {
            uVar28 = (ulong)uVar10;
          }
          iVar32 = 0x200;
          if (sVar1 == 0) {
            iVar32 = local_640[local_6a8][(long)local_718];
          }
          uVar46 = iVar32 + local_678[lVar42][uVar28];
          iVar32 = (int)local_5f8;
          if (2 < uVar10) {
            iVar26 = (int)sVar1 - (uVar9 << ((byte)local_6d0 & 0x1f));
            iVar29 = uVar9 * iVar32 + iVar26;
            lVar36 = (long)(iVar29 + iVar32);
            uVar19 = (uint)levels_buf[lVar36 + 1] +
                     (uint)levels_buf[lVar36] + (uint)levels_buf[(long)iVar29 + 1] + 1 >> 1;
            uVar25 = (ulong)uVar19;
            if (5 < uVar19) {
              uVar25 = 6;
            }
            if (sVar1 != 0) {
              if (((int)uVar9 < 2) && (iVar26 < 2)) {
                uVar25 = (ulong)((int)uVar25 + 7);
              }
              else {
                uVar25 = (ulong)((int)uVar25 + 0xe);
              }
            }
            uVar19 = 0x1f;
            if (uVar10 - 0xe != 0) {
              for (; uVar10 - 0xe >> uVar19 == 0; uVar19 = uVar19 - 1) {
              }
            }
            uVar19 = (uVar19 ^ 0x1f) << 10 ^ 0x7e00;
            uVar21 = 0xf;
            if (uVar10 < 0xf) {
              uVar21 = (ulong)uVar10;
              uVar19 = 0;
            }
            uVar46 = uVar46 + uVar19 + local_610[uVar25 - 1][uVar21 + 0x17];
          }
          local_708 = (int (*) [26])(ulong)uVar46;
          if (uVar10 == 1) {
            uVar19 = local_678[lVar42][0];
            _col = (int (*) [26])0x0;
            local_608 = local_728;
            local_710 = (int (*) [26])((ulong)local_710._4_4_ << 0x20);
            local_670 = (int (*) [26])0x0;
            local_720 = (uint8_t *)0x0;
          }
          else {
            uVar46 = uVar10 - 1;
            local_720 = (uint8_t *)(ulong)uVar46;
            iVar18 = ((int)(iVar18 * uVar46) >> (bVar17 & 0x1f) ^ uVar11) + uVar35;
            local_710 = (int (*) [26])CONCAT44(local_710._4_4_,iVar18);
            lVar36 = (long)(iVar38 - iVar18 << (bVar17 & 0x1f));
            if (local_688 == (qm_val_t *)0x0) {
              uVar25 = lVar36 * lVar36;
            }
            else {
              uVar25 = (ulong)local_688[lVar24] * lVar36 * (ulong)local_688[lVar24] * lVar36 + 0x200
                       >> 10;
            }
            puVar16 = (uint8_t *)0x3;
            if (uVar46 < 3) {
              puVar16 = local_720;
            }
            iVar18 = 0x200;
            if (sVar1 == 0) {
              iVar18 = local_640[local_6a8][uVar35];
            }
            uVar19 = iVar18 + local_678[lVar42][(long)puVar16];
            if (2 < uVar46) {
              iVar18 = iVar22 - (uVar9 << ((byte)local_6d0 & 0x1f));
              iVar38 = uVar9 * iVar32 + iVar18;
              lVar42 = (long)(iVar38 + iVar32);
              uVar40 = (uint)levels_buf[lVar42 + 1] +
                       (uint)levels_buf[lVar42] + (uint)levels_buf[(long)iVar38 + 1] + 1 >> 1;
              uVar21 = (ulong)uVar40;
              if (5 < uVar40) {
                uVar21 = 6;
              }
              if (sVar1 != 0) {
                if (((int)uVar9 < 2) && (iVar18 < 2)) {
                  uVar21 = (ulong)((int)uVar21 + 7);
                }
                else {
                  uVar21 = (ulong)((int)uVar21 + 0xe);
                }
              }
              uVar9 = 0x1f;
              if (uVar10 - 0xf != 0) {
                for (; uVar10 - 0xf >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              uVar9 = (uVar9 ^ 0x1f) << 10 ^ 0x7e00;
              puVar16 = (uint8_t *)0xf;
              if (uVar46 < 0xf) {
                uVar9 = 0;
                puVar16 = local_720;
              }
              uVar19 = uVar19 + uVar9 + local_610[uVar21 - 1][(long)(puVar16 + 0x17)];
            }
            _col = (int (*) [26])(ulong)((uVar11 ^ uVar46) + uVar35);
            local_670 = (int (*) [26])(uVar25 - local_668);
            local_608 = (int (*) [26])((long)local_728 + (long)local_670);
          }
          local_690 = (ulong)uVar19;
          if (puVar13 == (uint8_t *)0x0) {
            uVar25 = 0;
          }
          else {
            uVar25 = 1;
            if ((long)local_5e8 < (long)puVar13) {
              uVar25 = (ulong)((long)(iVar23 >> 2) < (long)puVar13) | 2;
            }
          }
          iVar18 = (int)puVar13 + 1;
          local_638 = (int (*) [26])CONCAT44(local_638._4_4_,iVar18);
          local_700 = puVar13;
          local_660 = uVar41;
          local_5e0 = levels_buf + lVar14;
          iVar18 = get_eob_cost(iVar18,local_658,local_6c8,'\0');
          iVar38 = (int)_col_2;
          bVar17 = (byte)local_6d0;
          if (sVar1 == 0) {
            iVar32 = local_618[uVar25][(int)uVar28 - 1] +
                     local_640[local_6a8][(ulong)local_718 & 0xffffffff];
            if (2 < uVar10) {
              lVar14 = 0;
              goto LAB_00370f3d;
            }
          }
          else {
            iVar32 = local_618[uVar25][(int)uVar28 - 1] + 0x200;
            if (2 < uVar10) {
              lVar14 = 0xe;
              if (iVar38 < 2) {
                lVar14 = 7;
              }
              if (1 < (int)sVar1 - (iVar38 << (bVar17 & 0x1f))) {
                lVar14 = 0xe;
              }
LAB_00370f3d:
              uVar9 = 0x1f;
              if (uVar10 - 0xe != 0) {
                for (; uVar10 - 0xe >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              uVar9 = (uVar9 ^ 0x1f) << 10 ^ 0x7e00;
              uVar41 = 0xf;
              if (uVar10 < 0xf) {
                uVar41 = (ulong)uVar10;
                uVar9 = 0;
              }
              iVar32 = uVar9 + iVar32 + local_610[lVar14 + -1][uVar41 + 0x17];
            }
          }
          paiVar43 = (int (*) [26])(uVar31 - local_668);
          uVar41 = (ulong)(uint)(iVar32 + iVar18);
          lVar14 = (long)paiVar43 * 0x80 + ((iVar32 + iVar18) * local_6e0 + 0x100 >> 9);
          bVar47 = false;
          uVar9 = (uint)local_720;
          paiVar15 = paiVar43;
          if (uVar9 == 0) {
            bVar4 = false;
          }
          else {
            uVar11 = 3;
            if (uVar9 < 3) {
              uVar11 = uVar9;
            }
            if (sVar1 == 0) {
              iVar32 = local_618[uVar25][uVar11 - 1] +
                       local_640[local_6a8][(ulong)local_718 & 0xffffffff];
              if (2 < uVar9) {
                lVar42 = 0;
                goto LAB_00371042;
              }
            }
            else {
              iVar32 = local_618[uVar25][uVar11 - 1] + 0x200;
              if (2 < uVar9) {
                lVar42 = 0xe;
                if (iVar38 < 2) {
                  lVar42 = 7;
                }
                if (1 < (int)sVar1 - (iVar38 << (bVar17 & 0x1f))) {
                  lVar42 = 0xe;
                }
LAB_00371042:
                uVar11 = 0x1f;
                if (uVar9 - 0xe != 0) {
                  for (; uVar9 - 0xe >> uVar11 == 0; uVar11 = uVar11 - 1) {
                  }
                }
                uVar11 = (uVar11 ^ 0x1f) << 10 ^ 0x7e00;
                uVar31 = 0xf;
                if (uVar9 < 0xf) {
                  uVar31 = (ulong)local_720 & 0xffffffff;
                  uVar11 = 0;
                }
                iVar32 = uVar11 + iVar32 + local_610[lVar42 + -1][uVar31 + 0x17];
              }
            }
            lVar42 = (long)local_670 * 0x80 + ((iVar32 + iVar18) * local_6e0 + 0x100 >> 9);
            bVar4 = false;
            if (lVar42 < lVar14) {
              bVar4 = true;
              uVar41 = (ulong)(uint)(iVar32 + iVar18);
              paiVar15 = local_670;
              lVar14 = lVar42;
            }
          }
          iVar18 = (int)local_660;
          lVar42 = ((long)local_728 + (long)paiVar43) * 0x80 +
                   (((int)local_708 + iVar18) * local_6e0 + 0x100 >> 9);
          if (((local_700 < (uint8_t *)0x6) + 1 < uVar10 || sharpness == 0) &&
             (lVar36 = (long)local_608 * 0x80 + (((int)local_690 + iVar18) * local_6e0 + 0x100 >> 9)
             , lVar36 < lVar42)) {
            bVar47 = true;
            local_708 = (int (*) [26])(local_690 & 0xffffffff);
            lVar42 = lVar36;
            paiVar43 = local_670;
          }
          if ((sharpness == 0 || (uint8_t *)0x3 < local_700) && (lVar14 < lVar42)) {
            if (0 < (int)uVar45) {
              uVar31 = 0;
              do {
                iVar18 = nz_ci[uVar31];
                levels_buf[iVar18 + (iVar18 >> (bVar17 & 0x1f)) * 4] = '\0';
                local_6f8[iVar18] = 0;
                local_6e8[iVar18] = 0;
                uVar31 = uVar31 + 1;
              } while (uVar45 != uVar31);
            }
            local_6b0 = (ulong)local_638 & 0xffffffff;
            uVar45 = 0;
            local_708 = paiVar15;
            bVar47 = bVar4;
          }
          else {
            paiVar15 = (int (*) [26])((long)*local_728 + (long)*paiVar43);
            uVar41 = (ulong)(uint)((int)local_708 + iVar18);
          }
          if (bVar47) {
            local_6f8[lVar24] = (tran_low_t)_col;
            local_6e8[lVar24] = (tran_low_t)local_710;
            uVar6 = (uint8_t)local_720;
            if (0x7e < (int)uVar9) {
              uVar6 = '\x7f';
            }
            *local_5e0 = uVar6;
          }
          iqmatrix = local_6b8;
          puVar16 = local_700;
          uVar37 = local_6c0;
          uVar31 = local_6d0;
          qcoeff = local_6f8;
          ptVar44 = local_6e8;
          local_728 = paiVar15;
          if (local_6f8[lVar24] != 0) {
            nz_ci[(int)uVar45] = iVar22;
            uVar45 = uVar45 + 1;
          }
        }
        puVar13 = puVar16 + -1;
        scan = local_650;
      } while ((0 < (long)puVar16) && ((int)uVar45 < 3));
    }
  }
  else {
    if (bVar17 == 1) {
      uVar41 = (ulong)local_72c;
      uVar45 = 1;
      local_710 = local_628;
      if (1 < (ushort)local_6b0) {
        uVar45 = 1;
        local_670 = (int (*) [26])((long)(1 << (bVar5 & 0x1f)) + 4);
        local_610 = (int (*) [26])(long)(2 << (bVar5 & 0x1f));
        local_638 = (int (*) [26])(long)(3 << (bVar5 & 0x1f));
        local_640 = (int (*) [2])(long)(4 << (bVar5 & 0x1f));
        local_5e8 = local_6c8->base_eob_cost;
        local_678 = local_6c8->base_cost;
        local_618 = (int (*) [3])local_6c8->dc_sign_cost;
        iVar22 = (int)local_670 * 2;
        iVar32 = iVar18 << (bVar5 & 0x1f);
        local_680 = local_6c8->lps_cost;
        iVar38 = iVar32 + 3;
        iVar23 = iVar32 + 7;
        if (-1 < iVar18 << (bVar5 & 0x1f)) {
          iVar38 = iVar32;
          iVar23 = iVar32;
        }
        do {
          sVar1 = scan[(long)puVar13];
          lVar24 = (long)sVar1;
          iVar18 = (int)local_600[lVar24 != 0];
          if (local_6b8 != (qm_val_t *)0x0) {
            iVar18 = (int)((uint)local_6b8[lVar24] * iVar18 + 0x10) >> 5;
          }
          bVar17 = (byte)uVar31;
          iVar32 = (int)sVar1;
          uVar11 = iVar32 >> (bVar17 & 0x1f);
          _col_2 = (int (*) [26])(ulong)uVar11;
          lVar14 = (long)(int)((int)sVar1 + uVar11 * 4);
          piVar34 = (int *)(levels_buf + lVar14);
          uVar9 = (uint)""[(byte)(&stack0x00000000)
                                 [(long)*(int (*) [8])(local_640 + 2 + -0xab) + lVar14]] +
                  (uint)""[*(byte *)((long)(*local_638 + 3) + (long)piVar34)] +
                  (uint)""[*(byte *)((long)(*local_610 + 2) + (long)piVar34)] +
                  (uint)""[levels_buf[lVar14 + 1]] +
                  (uint)""[*(byte *)((long)piVar34 + (long)(local_670 + -0xe) + 0x5b0)] + 1 >> 1;
          if (3 < uVar9) {
            uVar9 = 4;
          }
          uVar10 = qcoeff[lVar24];
          if (uVar10 == 0) {
            uVar41 = (ulong)(uint)((int)uVar41 +
                                  local_678[(ulong)uVar9 + (long)nz_map_ctx_offset_1d[(int)uVar11]]
                                  [0]);
            puVar16 = puVar13;
          }
          else {
            uVar35 = -uVar10;
            if (0 < (int)uVar10) {
              uVar35 = uVar10;
            }
            iVar26 = local_630[lVar24];
            bVar5 = (byte)uVar37;
            lVar14 = (long)(iVar26 << (bVar5 & 0x1f));
            if (local_688 == (qm_val_t *)0x0) {
              local_668 = lVar14 * lVar14;
              lVar14 = (long)(iVar26 - ptVar44[lVar24] << (bVar5 & 0x1f));
              uVar31 = lVar14 * lVar14;
            }
            else {
              lVar14 = lVar14 * (ulong)local_688[lVar24];
              local_668 = lVar14 * lVar14 + 0x200U >> 10;
              lVar14 = (long)(iVar26 - ptVar44[lVar24] << (bVar5 & 0x1f)) * (ulong)local_688[lVar24]
              ;
              uVar31 = lVar14 * lVar14 + 0x200U >> 10;
            }
            local_6a8 = (long)txb_ctx->dc_sign_ctx;
            uVar10 = (int)uVar10 >> 0x1f;
            uVar46 = -uVar10;
            local_728 = (int (*) [26])(ulong)uVar46;
            uVar28 = 3;
            if (uVar35 < 3) {
              uVar28 = (ulong)uVar35;
            }
            iVar29 = 0x200;
            if (sVar1 == 0) {
              iVar29 = (*local_618)[local_6a8 * 2 + (long)local_728];
            }
            iVar30 = (int)((ulong)uVar9 + (long)nz_map_ctx_offset_1d[(int)uVar11]);
            uVar9 = iVar29 + local_678[iVar30][uVar28];
            iVar29 = (int)local_670;
            if (2 < uVar35) {
              iVar27 = uVar11 * iVar29 + ((int)sVar1 - (uVar11 << (bVar17 & 0x1f)));
              uVar19 = (uint)levels_buf[iVar27 + iVar22] +
                       (uint)levels_buf[iVar29 + iVar27] + (uint)levels_buf[(long)iVar27 + 1] + 1 >>
                       1;
              if (5 < uVar19) {
                uVar19 = 6;
              }
              if (sVar1 != 0) {
                if (uVar11 == 0) {
                  uVar19 = uVar19 + 7;
                }
                else {
                  uVar19 = uVar19 + 0xe;
                }
              }
              uVar40 = 0x1f;
              if (uVar35 - 0xe != 0) {
                for (; uVar35 - 0xe >> uVar40 == 0; uVar40 = uVar40 - 1) {
                }
              }
              uVar40 = (uVar40 ^ 0x1f) << 10 ^ 0x7e00;
              uVar25 = 0xf;
              if (uVar35 < 0xf) {
                uVar25 = (ulong)uVar35;
                uVar40 = 0;
              }
              uVar9 = uVar9 + uVar40 + local_680[(ulong)uVar19 - 1][uVar25 + 0x17];
            }
            local_708 = (int (*) [26])(ulong)uVar9;
            if (uVar35 == 1) {
              uVar19 = local_678[iVar30][0];
              local_720 = (uint8_t *)0x0;
              local_608 = local_710;
              iVar18 = 0;
              local_718 = (int (*) [26])0x0;
              _col = (int (*) [26])0x0;
            }
            else {
              uVar9 = uVar35 - 1;
              _col = (int (*) [26])(ulong)uVar9;
              iVar18 = ((int)(iVar18 * uVar9) >> (bVar5 & 0x1f) ^ uVar10) + uVar46;
              lVar14 = (long)(iVar26 - iVar18 << (bVar5 & 0x1f));
              if (local_688 == (qm_val_t *)0x0) {
                local_718 = (int (*) [26])(lVar14 * lVar14);
              }
              else {
                local_718 = (int (*) [26])
                            ((ulong)local_688[lVar24] * lVar14 * (ulong)local_688[lVar24] * lVar14 +
                             0x200 >> 10);
              }
              uVar25 = 3;
              if (uVar9 < 3) {
                uVar25 = (ulong)uVar9;
              }
              iVar26 = 0x200;
              if (sVar1 == 0) {
                iVar26 = (*local_618)[local_6a8 * 2 + (ulong)uVar46];
              }
              uVar19 = iVar26 + local_678[iVar30][uVar25];
              if (2 < uVar9) {
                iVar26 = uVar11 * iVar29 + (iVar32 - (uVar11 << (bVar17 & 0x1f)));
                uVar40 = (uint)levels_buf[iVar26 + iVar22] +
                         (uint)levels_buf[iVar29 + iVar26] + (uint)levels_buf[(long)iVar26 + 1] + 1
                         >> 1;
                if (5 < uVar40) {
                  uVar40 = 6;
                }
                if (sVar1 != 0) {
                  if (uVar11 == 0) {
                    uVar40 = uVar40 + 7;
                  }
                  else {
                    uVar40 = uVar40 + 0xe;
                  }
                }
                uVar11 = 0x1f;
                if (uVar35 - 0xf != 0) {
                  for (; uVar35 - 0xf >> uVar11 == 0; uVar11 = uVar11 - 1) {
                  }
                }
                uVar11 = (uVar11 ^ 0x1f) << 10 ^ 0x7e00;
                uVar25 = 0xf;
                if (uVar9 < 0xf) {
                  uVar25 = (ulong)uVar9;
                  uVar11 = 0;
                }
                uVar19 = uVar19 + uVar11 + local_680[(ulong)uVar40 - 1][uVar25 + 0x17];
              }
              local_720 = (uint8_t *)(ulong)((uVar10 ^ uVar9) + uVar46);
              local_718 = (int (*) [26])((long)local_718 - local_668);
              local_608 = (int (*) [26])((long)local_710 + (long)local_718);
            }
            local_690 = (ulong)uVar19;
            local_5e0 = (uint8_t *)CONCAT44(local_5e0._4_4_,iVar18);
            if (puVar13 == (uint8_t *)0x0) {
              uVar25 = 0;
            }
            else {
              uVar25 = 1;
              if ((long)(iVar23 >> 3) < (long)puVar13) {
                uVar25 = (ulong)((long)(iVar38 >> 2) < (long)puVar13) | 2;
              }
            }
            iVar18 = (int)puVar13 + 1;
            local_5f0 = (int (*) [3])CONCAT44(local_5f0._4_4_,iVar18);
            local_700 = puVar13;
            local_660 = uVar41;
            local_5f8 = piVar34;
            iVar18 = get_eob_cost(iVar18,local_658,local_6c8,'\x01');
            uVar9 = (uint)_col;
            if (sVar1 == 0) {
              iVar26 = local_5e8[uVar25][(int)uVar28 - 1] +
                       (*local_618)[local_6a8 * 2 + ((ulong)local_728 & 0xffffffff)];
              if (2 < uVar35) {
                lVar14 = 0;
                goto LAB_0037054a;
              }
            }
            else {
              iVar26 = local_5e8[uVar25][(int)uVar28 - 1] + 0x200;
              if (2 < uVar35) {
                lVar14 = 0xe;
                if (col_2 == 0) {
                  lVar14 = 7;
                }
LAB_0037054a:
                uVar11 = 0x1f;
                if (uVar35 - 0xe != 0) {
                  for (; uVar35 - 0xe >> uVar11 == 0; uVar11 = uVar11 - 1) {
                  }
                }
                uVar11 = (uVar11 ^ 0x1f) << 10 ^ 0x7e00;
                uVar41 = 0xf;
                if (uVar35 < 0xf) {
                  uVar41 = (ulong)uVar35;
                  uVar11 = 0;
                }
                iVar26 = uVar11 + iVar26 + local_680[lVar14 + -1][uVar41 + 0x17];
              }
            }
            paiVar43 = (int (*) [26])(uVar31 - local_668);
            uVar41 = (ulong)(uint)(iVar26 + iVar18);
            lVar14 = (long)paiVar43 * 0x80 + ((iVar26 + iVar18) * local_6e0 + 0x100 >> 9);
            iVar26 = 0;
            paiVar15 = paiVar43;
            if (uVar9 == 0) {
              iVar29 = 0;
            }
            else {
              uVar11 = 3;
              if (uVar9 < 3) {
                uVar11 = uVar9;
              }
              if (sVar1 == 0) {
                iVar30 = local_5e8[uVar25][uVar11 - 1] +
                         (*local_618)[local_6a8 * 2 + ((ulong)local_728 & 0xffffffff)];
                if (2 < uVar9) {
                  lVar42 = 0;
                  goto LAB_0037062e;
                }
              }
              else {
                iVar30 = local_5e8[uVar25][uVar11 - 1] + 0x200;
                if (2 < uVar9) {
                  lVar42 = 0xe;
                  if (col_2 == 0) {
                    lVar42 = 7;
                  }
LAB_0037062e:
                  uVar11 = 0x1f;
                  if (uVar9 - 0xe != 0) {
                    for (; uVar9 - 0xe >> uVar11 == 0; uVar11 = uVar11 - 1) {
                    }
                  }
                  uVar11 = (uVar11 ^ 0x1f) << 10 ^ 0x7e00;
                  uVar31 = 0xf;
                  if (uVar9 < 0xf) {
                    uVar31 = (ulong)_col & 0xffffffff;
                    uVar11 = 0;
                  }
                  iVar30 = uVar11 + iVar30 + local_680[lVar42 + -1][uVar31 + 0x17];
                }
              }
              lVar42 = (long)local_718 * 0x80 + ((iVar30 + iVar18) * local_6e0 + 0x100 >> 9);
              iVar29 = 0;
              if (lVar42 < lVar14) {
                iVar29 = 1;
                uVar41 = (ulong)(uint)(iVar30 + iVar18);
                paiVar15 = local_718;
                lVar14 = lVar42;
              }
            }
            local_728 = (int (*) [26])CONCAT44(local_728._4_4_,iVar29);
            iVar30 = (int)local_660;
            iVar18 = (int)local_708;
            lVar42 = ((long)local_710 + (long)paiVar43) * 0x80 +
                     ((iVar18 + iVar30) * local_6e0 + 0x100 >> 9);
            if ((local_700 < (uint8_t *)0x6) + 1 < uVar35 || sharpness == 0) {
              lVar36 = (long)local_608 * 0x80 + (((int)local_690 + iVar30) * local_6e0 + 0x100 >> 9)
              ;
              iVar26 = 0;
              if (lVar36 < lVar42) {
                iVar26 = 1;
                lVar42 = lVar36;
                paiVar43 = local_718;
                iVar18 = (int)local_690;
              }
            }
            if ((sharpness == 0 || (uint8_t *)0x3 < local_700) && (lVar14 < lVar42)) {
              iVar26 = iVar29;
              if ((int)uVar45 < 1) {
                uVar45 = 0;
                local_6b0 = (ulong)local_5f0 & 0xffffffff;
              }
              else {
                uVar31 = (ulong)uVar45;
                uVar28 = 0;
                do {
                  iVar18 = nz_ci[uVar28];
                  levels_buf[iVar18 + (iVar18 >> ((byte)local_6d0 & 0x1f)) * 4] = '\0';
                  uVar45 = 0;
                  local_6f8[iVar18] = 0;
                  local_6e8[iVar18] = 0;
                  uVar28 = uVar28 + 1;
                } while (uVar31 != uVar28);
                local_6b0 = (ulong)local_5f0 & 0xffffffff;
              }
            }
            else {
              paiVar15 = (int (*) [26])((long)*local_710 + (long)*paiVar43);
              uVar41 = (ulong)(uint)(iVar18 + iVar30);
            }
            if (iVar26 != 0) {
              local_6f8[lVar24] = (tran_low_t)local_720;
              local_6e8[lVar24] = (tran_low_t)local_5e0;
              uVar6 = (uint8_t)_col;
              if (0x7e < (int)uVar9) {
                uVar6 = '\x7f';
              }
              *(uint8_t *)local_5f8 = uVar6;
            }
            puVar16 = local_700;
            uVar37 = local_6c0;
            uVar31 = local_6d0;
            qcoeff = local_6f8;
            ptVar44 = local_6e8;
            local_710 = paiVar15;
            if (local_6f8[lVar24] != 0) {
              nz_ci[(int)uVar45] = iVar32;
              uVar45 = uVar45 + 1;
            }
          }
          puVar13 = puVar16 + -1;
          scan = local_650;
          iqmatrix = local_6b8;
        } while ((0 < (long)puVar16) && ((int)uVar45 < 3));
      }
      local_72c = (uint)uVar41;
      local_628 = local_710;
      goto LAB_003712ef;
    }
    uVar45 = 1;
    if (bVar17 != 2) goto LAB_003712ef;
    uVar41 = (ulong)local_72c;
    uVar45 = 1;
    local_728 = local_628;
    if (1 < (ushort)local_6b0) {
      uVar45 = 1;
      local_690 = (long)(1 << (bVar5 & 0x1f)) + 4;
      local_610 = (int (*) [26])CONCAT44(local_610._4_4_,~(-1 << (bVar5 & 0x1f)));
      local_5f0 = local_6c8->base_eob_cost;
      local_678 = local_6c8->base_cost;
      local_680 = (int (*) [26])local_6c8->dc_sign_cost;
      local_638 = local_6c8->lps_cost;
      iVar22 = iVar18 << (bVar5 & 0x1f);
      bVar47 = -1 < iVar18 << (bVar5 & 0x1f);
      iVar18 = iVar22 + 7;
      if (bVar47) {
        iVar18 = iVar22;
      }
      iVar23 = iVar22 + 3;
      if (bVar47) {
        iVar23 = iVar22;
      }
      puVar13 = (uint8_t *)(ulong)uVar9;
      local_5e8 = (int (*) [3])(long)(iVar23 >> 2);
      local_618 = (int (*) [3])(long)(iVar18 >> 3);
      do {
        sVar1 = scan[(long)puVar13];
        lVar24 = (long)sVar1;
        iVar18 = (int)local_600[lVar24 != 0];
        if (iqmatrix != (qm_val_t *)0x0) {
          iVar18 = (int)((uint)iqmatrix[lVar24] * iVar18 + 0x10) >> 5;
        }
        local_700 = (uint8_t *)CONCAT44(local_700._4_4_,iVar18);
        iVar22 = (int)sVar1;
        uVar10 = iVar22 >> ((byte)uVar31 & 0x1f);
        _col = (int (*) [26])(ulong)uVar10;
        uVar9 = qcoeff[lVar24];
        lVar14 = (long)(int)((int)sVar1 + uVar10 * 4);
        uVar11 = (uint)""[levels_buf[lVar14 + 4]] +
                 (uint)""[levels_buf[lVar14 + 3]] +
                 (uint)""[levels_buf[lVar14 + 2]] + (uint)""[levels_buf[lVar14 + 1]] +
                 (uint)""[(levels_buf + lVar14)[local_690]] + 1 >> 1;
        if (3 < uVar11) {
          uVar11 = 4;
        }
        if (uVar9 == 0) {
          uVar41 = (ulong)(uint)((int)uVar41 +
                                local_678[(ulong)uVar11 +
                                          (long)nz_map_ctx_offset_1d[(int)sVar1 & (uint)local_610]]
                                [0]);
          puVar16 = puVar13;
        }
        else {
          uVar35 = -uVar9;
          if (0 < (int)uVar9) {
            uVar35 = uVar9;
          }
          iVar23 = local_630[lVar24];
          bVar17 = (byte)uVar37;
          lVar42 = (long)(iVar23 << (bVar17 & 0x1f));
          if (local_688 == (qm_val_t *)0x0) {
            local_670 = (int (*) [26])(lVar42 * lVar42);
            lVar42 = (long)(iVar23 - ptVar44[lVar24] << (bVar17 & 0x1f));
            uVar28 = lVar42 * lVar42;
          }
          else {
            lVar42 = lVar42 * (ulong)local_688[lVar24];
            local_670 = (int (*) [26])(lVar42 * lVar42 + 0x200U >> 10);
            lVar42 = (long)(iVar23 - ptVar44[lVar24] << (bVar17 & 0x1f)) * (ulong)local_688[lVar24];
            uVar28 = lVar42 * lVar42 + 0x200U >> 10;
          }
          local_6a8 = (long)txb_ctx->dc_sign_ctx;
          uVar9 = (int)uVar9 >> 0x1f;
          uVar46 = -uVar9;
          local_718 = (int (*) [26])(ulong)uVar46;
          uVar25 = 3;
          if (uVar35 < 3) {
            uVar25 = (ulong)uVar35;
          }
          iVar38 = 0x200;
          if (sVar1 == 0) {
            iVar38 = (*local_680)[local_6a8 * 2 + (long)local_718];
          }
          iVar32 = (int)((ulong)uVar11 + (long)nz_map_ctx_offset_1d[(int)sVar1 & (uint)local_610]);
          uVar11 = iVar38 + local_678[iVar32][uVar25];
          iVar38 = (int)local_690;
          if (2 < uVar35) {
            iVar26 = uVar10 << ((byte)uVar31 & 0x1f);
            iVar29 = uVar10 * iVar38 + (iVar22 - iVar26);
            uVar19 = (uint)levels_buf[(long)iVar29 + 2] +
                     (uint)levels_buf[iVar29 + iVar38] + (uint)levels_buf[(long)iVar29 + 1] + 1 >> 1
            ;
            if (5 < uVar19) {
              uVar19 = 6;
            }
            if (sVar1 != 0) {
              if (iVar22 == iVar26) {
                uVar19 = uVar19 + 7;
              }
              else {
                uVar19 = uVar19 + 0xe;
              }
            }
            uVar40 = 0x1f;
            if (uVar35 - 0xe != 0) {
              for (; uVar35 - 0xe >> uVar40 == 0; uVar40 = uVar40 - 1) {
              }
            }
            uVar31 = 0xf;
            if (uVar35 < 0xf) {
              uVar31 = (ulong)uVar35;
            }
            uVar40 = (uVar40 ^ 0x1f) << 10 ^ 0x7e00;
            if (uVar35 < 0xf) {
              uVar40 = 0;
            }
            uVar11 = uVar11 + uVar40 + local_638[(ulong)uVar19 - 1][uVar31 + 0x17];
            uVar37 = local_6c0;
          }
          local_708 = (int (*) [26])(ulong)uVar11;
          if (uVar35 == 1) {
            uVar19 = local_678[iVar32][0];
            local_660 = 0;
            local_608 = local_728;
            local_700._0_4_ = 0;
            _col_2 = (int (*) [26])0x0;
            local_710 = (int (*) [26])0x0;
          }
          else {
            uVar11 = uVar35 - 1;
            local_710 = (int (*) [26])(ulong)uVar11;
            local_700._0_4_ = ((int)(iVar18 * uVar11) >> ((byte)uVar37 & 0x1f) ^ uVar9) + uVar46;
            lVar42 = (long)(iVar23 - (int)local_700 << ((byte)uVar37 & 0x1f));
            if (local_688 == (qm_val_t *)0x0) {
              uVar31 = lVar42 * lVar42;
            }
            else {
              uVar31 = (ulong)local_688[lVar24] * lVar42 * (ulong)local_688[lVar24] * lVar42 + 0x200
                       >> 10;
            }
            paiVar15 = (int (*) [26])0x3;
            if (uVar11 < 3) {
              paiVar15 = local_710;
            }
            iVar18 = 0x200;
            if (sVar1 == 0) {
              iVar18 = (*local_680)[local_6a8 * 2 + (ulong)uVar46];
            }
            uVar19 = iVar18 + local_678[iVar32][(long)paiVar15];
            if (2 < uVar11) {
              iVar18 = uVar10 << ((byte)local_6d0 & 0x1f);
              iVar23 = uVar10 * iVar38 + (iVar22 - iVar18);
              uVar10 = (uint)levels_buf[(long)iVar23 + 2] +
                       (uint)levels_buf[iVar23 + iVar38] + (uint)levels_buf[(long)iVar23 + 1] + 1 >>
                       1;
              uVar21 = (ulong)uVar10;
              if (5 < uVar10) {
                uVar21 = 6;
              }
              if (sVar1 != 0) {
                if (iVar22 == iVar18) {
                  uVar21 = (ulong)((int)uVar21 + 7);
                }
                else {
                  uVar21 = (ulong)((int)uVar21 + 0xe);
                }
              }
              uVar10 = 0x1f;
              if (uVar35 - 0xf != 0) {
                for (; uVar35 - 0xf >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              uVar10 = (uVar10 ^ 0x1f) << 10 ^ 0x7e00;
              paiVar15 = (int (*) [26])0xf;
              if (uVar11 < 0xf) {
                uVar10 = 0;
                paiVar15 = local_710;
              }
              uVar19 = uVar19 + uVar10 + local_638[uVar21 - 1][(long)((long)*paiVar15 + 0x17)];
            }
            local_660 = (ulong)((uVar9 ^ uVar11) + uVar46);
            _col_2 = (int (*) [26])(uVar31 - (long)local_670);
            local_608 = (int (*) [26])((long)local_728 + (long)_col_2);
          }
          local_5f8 = (int *)(ulong)uVar19;
          if (puVar13 == (uint8_t *)0x0) {
            uVar31 = 0;
          }
          else {
            uVar31 = 1;
            if ((long)local_618 < (long)puVar13) {
              uVar31 = (ulong)((long)local_5e8 < (long)puVar13) | 2;
            }
          }
          iVar18 = (int)puVar13 + 1;
          local_640 = (int (*) [2])CONCAT44(local_640._4_4_,iVar18);
          local_720 = puVar13;
          local_668 = uVar41;
          local_5e0 = levels_buf + lVar14;
          iVar18 = get_eob_cost(iVar18,local_658,local_6c8,'\x02');
          uVar9 = (uint)local_710;
          bVar17 = (byte)local_6d0;
          if (sVar1 == 0) {
            iVar23 = local_5f0[uVar31][(int)uVar25 - 1] +
                     (*local_680)[local_6a8 * 2 + ((ulong)local_718 & 0xffffffff)];
            if (2 < uVar35) {
              lVar14 = 0;
              goto LAB_0036fb2f;
            }
          }
          else {
            iVar23 = local_5f0[uVar31][(int)uVar25 - 1] + 0x200;
            if (2 < uVar35) {
              lVar14 = 0xe;
              if ((int)_col << (bVar17 & 0x1f) == iVar22) {
                lVar14 = 7;
              }
LAB_0036fb2f:
              uVar11 = 0x1f;
              if (uVar35 - 0xe != 0) {
                for (; uVar35 - 0xe >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
              uVar11 = (uVar11 ^ 0x1f) << 10 ^ 0x7e00;
              uVar41 = 0xf;
              if (uVar35 < 0xf) {
                uVar41 = (ulong)uVar35;
                uVar11 = 0;
              }
              iVar23 = uVar11 + iVar23 + local_638[lVar14 + -1][uVar41 + 0x17];
            }
          }
          paiVar43 = (int (*) [26])(uVar28 - (long)local_670);
          uVar41 = (ulong)(uint)(iVar23 + iVar18);
          lVar14 = (long)paiVar43 * 0x80 + ((iVar23 + iVar18) * local_6e0 + 0x100 >> 9);
          iVar23 = 0;
          paiVar15 = paiVar43;
          if (uVar9 == 0) {
            iVar38 = 0;
          }
          else {
            uVar11 = 3;
            if (uVar9 < 3) {
              uVar11 = uVar9;
            }
            if (sVar1 == 0) {
              iVar32 = local_5f0[uVar31][uVar11 - 1] +
                       (*local_680)[local_6a8 * 2 + ((ulong)local_718 & 0xffffffff)];
              if (2 < uVar9) {
                lVar42 = 0;
                goto LAB_0036fc14;
              }
            }
            else {
              iVar32 = local_5f0[uVar31][uVar11 - 1] + 0x200;
              if (2 < uVar9) {
                lVar42 = 0xe;
                if ((int)_col << (bVar17 & 0x1f) == iVar22) {
                  lVar42 = 7;
                }
LAB_0036fc14:
                uVar11 = 0x1f;
                if (uVar9 - 0xe != 0) {
                  for (; uVar9 - 0xe >> uVar11 == 0; uVar11 = uVar11 - 1) {
                  }
                }
                uVar11 = (uVar11 ^ 0x1f) << 10 ^ 0x7e00;
                uVar31 = 0xf;
                if (uVar9 < 0xf) {
                  uVar31 = (ulong)local_710 & 0xffffffff;
                  uVar11 = 0;
                }
                iVar32 = uVar11 + iVar32 + local_638[lVar42 + -1][uVar31 + 0x17];
              }
            }
            lVar42 = (long)_col_2 * 0x80 + ((iVar32 + iVar18) * local_6e0 + 0x100 >> 9);
            iVar38 = 0;
            if (lVar42 < lVar14) {
              iVar38 = 1;
              uVar41 = (ulong)(uint)(iVar32 + iVar18);
              paiVar15 = _col_2;
              lVar14 = lVar42;
            }
          }
          local_718 = (int (*) [26])CONCAT44(local_718._4_4_,iVar38);
          iVar18 = (int)local_708;
          iVar32 = (int)local_668;
          lVar42 = ((long)local_728 + (long)paiVar43) * 0x80 +
                   ((iVar18 + iVar32) * local_6e0 + 0x100 >> 9);
          if ((local_720 < (uint8_t *)0x6) + 1 < uVar35 || sharpness == 0) {
            lVar36 = (long)local_608 * 0x80 + (((int)local_5f8 + iVar32) * local_6e0 + 0x100 >> 9);
            iVar23 = 0;
            if (lVar36 < lVar42) {
              iVar23 = 1;
              lVar42 = lVar36;
              paiVar43 = _col_2;
              iVar18 = (int)local_5f8;
            }
          }
          if ((sharpness == 0 || (uint8_t *)0x3 < local_720) && (lVar14 < lVar42)) {
            iVar23 = iVar38;
            if ((int)uVar45 < 1) {
              uVar45 = 0;
              local_6b0 = (ulong)local_640 & 0xffffffff;
            }
            else {
              uVar31 = (ulong)uVar45;
              uVar28 = 0;
              do {
                iVar18 = nz_ci[uVar28];
                levels_buf[iVar18 + (iVar18 >> (bVar17 & 0x1f)) * 4] = '\0';
                uVar45 = 0;
                local_6f8[iVar18] = 0;
                local_6e8[iVar18] = 0;
                uVar28 = uVar28 + 1;
              } while (uVar31 != uVar28);
              local_6b0 = (ulong)local_640 & 0xffffffff;
            }
          }
          else {
            paiVar15 = (int (*) [26])((long)*local_728 + (long)*paiVar43);
            uVar41 = (ulong)(uint)(iVar18 + iVar32);
          }
          if (iVar23 != 0) {
            local_6f8[lVar24] = (tran_low_t)local_660;
            local_6e8[lVar24] = (int)local_700;
            uVar6 = (uint8_t)local_710;
            if (0x7e < (int)uVar9) {
              uVar6 = '\x7f';
            }
            *local_5e0 = uVar6;
          }
          puVar16 = local_720;
          uVar37 = local_6c0;
          uVar31 = local_6d0;
          qcoeff = local_6f8;
          ptVar44 = local_6e8;
          local_728 = paiVar15;
          if (local_6f8[lVar24] != 0) {
            nz_ci[(int)uVar45] = iVar22;
            uVar45 = uVar45 + 1;
          }
        }
        puVar13 = puVar16 + -1;
        scan = local_650;
        iqmatrix = local_6b8;
      } while ((0 < (long)puVar16) && ((int)uVar45 < 3));
    }
  }
  local_72c = (uint)uVar41;
  local_628 = local_728;
LAB_003712ef:
  iVar18 = (int)uVar31;
  uVar9 = (uint)puVar13;
  if ((((sharpness == 0) && (uVar9 == 0xffffffff)) && ((int)uVar45 < 3)) &&
     (local_6e0 * iVar12 + 0x100 >> 9 <
      (long)local_628 * 0x80 + (((long)(int)local_72c + (long)iVar8) * local_6e0 + 0x100 >> 9))) {
    if (0 < (int)uVar45) {
      uVar41 = 0;
      do {
        iVar22 = nz_ci[uVar41];
        qcoeff[iVar22] = 0;
        ptVar44[iVar22] = 0;
        uVar41 = uVar41 + 1;
      } while (uVar45 != uVar41);
    }
    local_72c = 0;
    local_6b0 = 0;
  }
  bVar17 = (byte)uVar31;
  bVar5 = (byte)local_6c0;
  if (local_620 == 0) {
    if (0 < (int)uVar9) {
      local_718 = (int (*) [26])(long)(1 << (bVar17 & 0x1f));
      local_708 = (int (*) [26])(*local_718 + 1);
      _col_2 = (int (*) [26])(long)(2 << (bVar17 & 0x1f));
      local_710 = (int (*) [26])local_6c8->base_cost;
      _col = local_6c8->lps_cost;
      lVar24 = ((ulong)puVar13 & 0xffffffff) + 1;
      do {
        sVar1 = scan[lVar24 + -1];
        lVar14 = (long)sVar1;
        iVar18 = (int)local_600[lVar14 != 0];
        if (iqmatrix != (qm_val_t *)0x0) {
          iVar18 = (int)((uint)iqmatrix[lVar14] * iVar18 + 0x10) >> 5;
        }
        iVar22 = (int)sVar1 >> ((byte)uVar31 & 0x1f);
        lVar42 = (long)((int)sVar1 + iVar22 * 4);
        pLVar39 = (LV_MAP_EOB_COST *)(levels_buf + lVar42);
        if (sVar1 == 0) {
          lVar42 = 0;
        }
        else {
          uVar9 = (uint)""[levels_buf[lVar42 + 2]] +
                  (uint)""[(levels_buf + lVar42 + 8)[(long)_col_2]] +
                  (uint)""[(levels_buf + lVar42 + 5)[(long)local_718]] +
                  (uint)""[levels_buf[lVar42 + 1]] +
                  (uint)""[*(byte *)((long)*local_708 + (long)pLVar39->eob_cost)] + 1 >> 1;
          uVar41 = (ulong)uVar9;
          if (3 < uVar9) {
            uVar41 = 4;
          }
          lVar42 = uVar41 + (long)av1_nz_map_ctx_offset[local_6a0][lVar14];
        }
        uVar9 = local_6f8[lVar14];
        if (uVar9 == 0) {
          iVar23 = (*(int (*) [8])((long)local_710 + lVar42 * 0x20))[0];
        }
        else {
          local_700 = (uint8_t *)CONCAT44(local_700._4_4_,iVar18);
          local_728 = (int (*) [26])CONCAT44(local_728._4_4_,uVar9);
          uVar45 = -uVar9;
          if (0 < (int)uVar9) {
            uVar45 = uVar9;
          }
          uVar11 = local_630[lVar14];
          uVar10 = -uVar11;
          if (0 < (int)uVar11) {
            uVar10 = uVar11;
          }
          uVar11 = local_6e8[lVar14];
          uVar35 = -uVar11;
          if (0 < (int)uVar11) {
            uVar35 = uVar11;
          }
          uVar41 = 3;
          if (uVar45 < 3) {
            uVar41 = (ulong)uVar45;
          }
          if (uVar45 < 4) {
            local_720 = (uint8_t *)
                        CONCAT44(local_720._4_4_,
                                 (*(int (*) [8])((long)local_710 + lVar42 * 0x20))
                                 [(ulong)uVar45 + 4]);
            iVar23 = (*(int (*) [8])((long)local_710 + lVar42 * 0x20))[uVar41] + 0x200;
            if (uVar45 == 3) goto LAB_00371e82;
          }
          else {
            local_720 = (uint8_t *)((ulong)local_720._4_4_ << 0x20);
LAB_00371e82:
            iVar23 = (int)sVar1 - (iVar22 << ((byte)local_6d0 & 0x1f));
            iVar38 = iVar22 * (int)local_708 + iVar23;
            lVar36 = (long)(iVar38 + (int)local_708);
            uVar11 = (uint)levels_buf[lVar36 + 1] +
                     (uint)levels_buf[lVar36] + (uint)levels_buf[(long)iVar38 + 1] + 1 >> 1;
            if (5 < uVar11) {
              uVar11 = 6;
            }
            uVar31 = (ulong)uVar11;
            if (sVar1 != 0) {
              if ((iVar22 < 2) && (iVar23 < 2)) {
                uVar31 = (ulong)(uVar11 + 7);
              }
              else {
                uVar31 = (ulong)(uVar11 + 0xe);
              }
            }
            uVar11 = 0xf;
            if (uVar45 < 0xf) {
              uVar11 = uVar45;
            }
            if (uVar45 < 0x10) {
              iVar22 = _col[uVar31][(ulong)uVar11 + 10];
              uVar19 = 0;
              uVar46 = 1;
              if (uVar45 == 0xf) {
LAB_00371f37:
                uVar19 = golomb_bits_cost[uVar46];
                iVar22 = iVar22 + golomb_cost_diff[uVar46];
              }
            }
            else {
              uVar46 = uVar45 - 0xe;
              iVar22 = 0;
              if (uVar45 < 0x2e) goto LAB_00371f37;
              uVar19 = 0x1f;
              if (uVar46 != 0) {
                for (; uVar46 >> uVar19 == 0; uVar19 = uVar19 - 1) {
                }
              }
              uVar19 = (uVar19 ^ 0x1f) << 10 ^ 0x7e00;
              local_660 = CONCAT44(local_660._4_4_,uVar45 - 0xf);
              iVar22 = (uint)((uVar45 - 0xf & uVar46) == 0) << 10;
            }
            local_720 = (uint8_t *)CONCAT44(local_720._4_4_,(int)local_720 + iVar22);
            iVar23 = uVar19 + (*(int (*) [8])((long)local_710 + lVar42 * 0x20))[uVar41] + 0x200 +
                     _col[uVar31 - 1][(ulong)uVar11 + 0x17];
            scan = local_650;
            iqmatrix = local_6b8;
          }
          local_658 = pLVar39;
          if (uVar10 < uVar35 || uVar10 - uVar35 == 0) {
            lVar42 = (long)(int)(uVar10 - uVar35 << (bVar5 & 0x1f));
            if (local_688 == (qm_val_t *)0x0) {
              uVar41 = lVar42 * lVar42;
            }
            else {
              uVar41 = (ulong)local_688[lVar14] * lVar42 * (ulong)local_688[lVar14] * lVar42 + 0x200
                       >> 10;
            }
            uVar11 = uVar45 - 1;
            uVar35 = (int)(iVar18 * uVar11) >> (bVar5 & 0x1f);
            local_700 = (uint8_t *)CONCAT44(local_700._4_4_,uVar35);
            lVar42 = (long)(int)(uVar10 - uVar35 << (bVar5 & 0x1f));
            if (local_688 == (qm_val_t *)0x0) {
              uVar31 = lVar42 * lVar42;
            }
            else {
              uVar31 = (ulong)local_688[lVar14] * lVar42 * (ulong)local_688[lVar14] * lVar42 + 0x200
                       >> 10;
            }
            if (sharpness == 0 || 1 < uVar45) {
              if ((long)(uVar31 * 0x80 + ((iVar23 - (int)local_720) * local_6e0 + 0x100 >> 9)) <
                  (long)(uVar41 * 0x80 + (iVar23 * local_6e0 + 0x100 >> 9))) {
                uVar9 = (int)uVar9 >> 0x1f;
                local_6f8[lVar14] = (uVar11 ^ uVar9) + -uVar9;
                local_6e8[lVar14] = (uVar35 ^ uVar9) + -uVar9;
                if (0x7e < uVar11) {
                  uVar11 = 0x7f;
                }
                *(uint8_t *)pLVar39->eob_cost[0] = (uint8_t)uVar11;
                iVar23 = iVar23 - (int)local_720;
              }
            }
          }
        }
        local_72c = local_72c + iVar23;
        lVar24 = lVar24 + -1;
        uVar9 = (int)puVar13 - 1;
        puVar13 = (uint8_t *)(ulong)uVar9;
        uVar31 = local_6d0;
      } while (1 < lVar24);
    }
    iVar18 = (int)uVar31;
    uVar37 = local_6c0;
    qcoeff = local_6f8;
  }
  else if (local_620 == 1) {
    if (0 < (int)uVar9) {
      local_700 = (uint8_t *)((long)(1 << (bVar17 & 0x1f)) + 4);
      local_708 = (int (*) [26])(long)(2 << (bVar17 & 0x1f));
      local_710 = (int (*) [26])(long)(3 << (bVar17 & 0x1f));
      local_658 = (LV_MAP_EOB_COST *)(long)(4 << (bVar17 & 0x1f));
      local_728 = (int (*) [26])local_6c8->base_cost;
      iVar18 = (int)local_700;
      local_718 = (int (*) [26])CONCAT44(local_718._4_4_,iVar18 * 2);
      _col_2 = local_6c8->lps_cost;
      lVar24 = ((ulong)puVar13 & 0xffffffff) + 1;
      do {
        sVar1 = scan[lVar24 + -1];
        lVar14 = (long)sVar1;
        iVar22 = (int)local_600[lVar14 != 0];
        if (iqmatrix != (qm_val_t *)0x0) {
          iVar22 = (int)((uint)iqmatrix[lVar14] * iVar22 + 0x10) >> 5;
        }
        iVar23 = (int)sVar1 >> ((byte)uVar31 & 0x1f);
        lVar42 = (long)((int)sVar1 + iVar23 * 4);
        paiVar15 = (int (*) [26])(levels_buf + lVar42);
        uVar9 = (uint)""[*(byte *)((long)(local_658->eob_cost[0] + 4) + (long)paiVar15)] +
                (uint)""[*(byte *)((long)(*local_710 + 3) + (long)paiVar15)] +
                (uint)""[*(byte *)((long)(*local_708 + 2) + (long)paiVar15)] +
                (uint)""[levels_buf[lVar42 + 1]] + (uint)""[local_700[(long)paiVar15]] + 1 >> 1;
        uVar41 = (ulong)uVar9;
        if (3 < uVar9) {
          uVar41 = 4;
        }
        uVar9 = qcoeff[lVar14];
        if (uVar9 == 0) {
          iVar38 = (*(int (*) [8])
                     ((long)local_728 + (uVar41 + (long)nz_map_ctx_offset_1d[iVar23]) * 0x20))[0];
        }
        else {
          local_720 = (uint8_t *)CONCAT44(local_720._4_4_,iVar22);
          local_6a0 = CONCAT44(local_6a0._4_4_,uVar9);
          uVar45 = -uVar9;
          if (0 < (int)uVar9) {
            uVar45 = uVar9;
          }
          uVar11 = local_630[lVar14];
          uVar10 = -uVar11;
          if (0 < (int)uVar11) {
            uVar10 = uVar11;
          }
          uVar11 = local_6e8[lVar14];
          uVar35 = -uVar11;
          if (0 < (int)uVar11) {
            uVar35 = uVar11;
          }
          iVar32 = (int)(uVar41 + (long)nz_map_ctx_offset_1d[iVar23]);
          uVar41 = 3;
          if (uVar45 < 3) {
            uVar41 = (ulong)uVar45;
          }
          if (uVar45 < 4) {
            iVar26 = (*(int (*) [8])((long)local_728 + (long)iVar32 * 0x20))[(ulong)uVar45 + 4];
            iVar38 = (*(int (*) [8])((long)local_728 + (long)iVar32 * 0x20))[uVar41] + 0x200;
            if (uVar45 == 3) goto LAB_003719f1;
          }
          else {
            iVar26 = 0;
LAB_003719f1:
            iVar38 = iVar23 * iVar18 + ((int)sVar1 - (iVar23 << ((byte)local_6d0 & 0x1f)));
            uVar11 = (uint)levels_buf[iVar38 + iVar18 * 2] +
                     (uint)levels_buf[iVar18 + iVar38] + (uint)levels_buf[(long)iVar38 + 1] + 1 >> 1
            ;
            if (5 < uVar11) {
              uVar11 = 6;
            }
            if (sVar1 != 0) {
              if (iVar23 == 0) {
                uVar11 = uVar11 + 7;
              }
              else {
                uVar11 = uVar11 + 0xe;
              }
            }
            uVar31 = 0xf;
            if (uVar45 < 0xf) {
              uVar31 = (ulong)uVar45;
            }
            if (uVar45 < 0x10) {
              iVar23 = _col_2[uVar11][uVar31 + 10];
              uVar19 = 0;
              uVar46 = 1;
              if (uVar45 == 0xf) {
LAB_00371a9b:
                uVar19 = golomb_bits_cost[uVar46];
                iVar23 = iVar23 + golomb_cost_diff[uVar46];
                _col = paiVar15;
              }
            }
            else {
              uVar46 = uVar45 - 0xe;
              iVar23 = 0;
              if (uVar45 < 0x2e) goto LAB_00371a9b;
              uVar19 = 0x1f;
              if (uVar46 != 0) {
                for (; uVar46 >> uVar19 == 0; uVar19 = uVar19 - 1) {
                }
              }
              uVar19 = (uVar19 ^ 0x1f) << 10 ^ 0x7e00;
              _col = (int (*) [26])CONCAT44(uStack_6d4,uVar45 - 0xf);
              iVar23 = (uint)((uVar45 - 0xf & uVar46) == 0) << 10;
            }
            iVar26 = iVar26 + iVar23;
            iVar38 = uVar19 + (*(int (*) [8])((long)local_728 + (long)iVar32 * 0x20))[uVar41] +
                              0x200 + _col_2[(ulong)uVar11 - 1][uVar31 + 0x17];
            scan = local_650;
            qcoeff = local_6f8;
          }
          if (uVar10 < uVar35 || uVar10 - uVar35 == 0) {
            lVar42 = (long)(int)(uVar10 - uVar35 << (bVar5 & 0x1f));
            if (local_688 == (qm_val_t *)0x0) {
              uVar41 = lVar42 * lVar42;
            }
            else {
              uVar41 = (ulong)local_688[lVar14] * lVar42 * (ulong)local_688[lVar14] * lVar42 + 0x200
                       >> 10;
            }
            uVar35 = uVar45 - 1;
            uVar11 = (int)(iVar22 * uVar35) >> (bVar5 & 0x1f);
            local_720 = (uint8_t *)CONCAT44(local_720._4_4_,uVar11);
            lVar42 = (long)(int)(uVar10 - uVar11 << (bVar5 & 0x1f));
            if (local_688 == (qm_val_t *)0x0) {
              uVar31 = lVar42 * lVar42;
            }
            else {
              uVar31 = (ulong)local_688[lVar14] * lVar42 * (ulong)local_688[lVar14] * lVar42 + 0x200
                       >> 10;
            }
            qcoeff = local_6f8;
            if ((sharpness == 0 || 1 < uVar45) &&
               ((long)(uVar31 * 0x80 + ((iVar38 - iVar26) * local_6e0 + 0x100 >> 9)) <
                (long)(uVar41 * 0x80 + (iVar38 * local_6e0 + 0x100 >> 9)))) {
              uVar9 = (int)uVar9 >> 0x1f;
              local_6f8[lVar14] = (uVar35 ^ uVar9) + -uVar9;
              local_6e8[lVar14] = (uVar11 ^ uVar9) + -uVar9;
              uVar6 = (uint8_t)uVar35;
              if (0x7e < uVar35) {
                uVar6 = '\x7f';
              }
              *(uint8_t *)*paiVar15 = uVar6;
              iVar38 = iVar38 - iVar26;
            }
          }
        }
        local_72c = local_72c + iVar38;
        lVar24 = lVar24 + -1;
        uVar9 = (int)puVar13 - 1;
        puVar13 = (uint8_t *)(ulong)uVar9;
        iqmatrix = local_6b8;
        uVar31 = local_6d0;
      } while (1 < lVar24);
    }
    iVar18 = (int)uVar31;
    uVar37 = local_6c0;
  }
  else if ((local_620 == 2) && (0 < (int)uVar9)) {
    local_700 = (uint8_t *)((long)(1 << (bVar17 & 0x1f)) + 4);
    uVar45 = ~(-1 << (bVar17 & 0x1f));
    local_708 = (int (*) [26])CONCAT44(local_708._4_4_,uVar45);
    local_710 = (int (*) [26])local_6c8->base_cost;
    local_728 = local_6c8->lps_cost;
    lVar24 = ((ulong)puVar13 & 0xffffffff) + 1;
    do {
      sVar1 = scan[lVar24 + -1];
      lVar14 = (long)sVar1;
      iVar18 = (int)local_600[lVar14 != 0];
      if (iqmatrix != (qm_val_t *)0x0) {
        iVar18 = (int)((uint)iqmatrix[lVar14] * iVar18 + 0x10) >> 5;
      }
      iVar22 = (int)sVar1 >> ((byte)uVar31 & 0x1f);
      uVar9 = local_6f8[lVar14];
      lVar42 = (long)((int)sVar1 + iVar22 * 4);
      local_720 = levels_buf + lVar42;
      uVar11 = (uint)""[levels_buf[lVar42 + 4]] +
               (uint)""[levels_buf[lVar42 + 3]] +
               (uint)""[levels_buf[lVar42 + 2]] + (uint)""[levels_buf[lVar42 + 1]] +
               (uint)""[local_700[(long)local_720]] + 1 >> 1;
      uVar41 = (ulong)uVar11;
      if (3 < uVar11) {
        uVar41 = 4;
      }
      if (uVar9 == 0) {
        iVar23 = (*(int (*) [8])
                   ((long)local_710 +
                   (uVar41 + (long)nz_map_ctx_offset_1d[(int)sVar1 & uVar45]) * 0x20))[0];
      }
      else {
        local_658 = (LV_MAP_EOB_COST *)CONCAT44(local_658._4_4_,uVar9);
        uVar11 = -uVar9;
        if (0 < (int)uVar9) {
          uVar11 = uVar9;
        }
        uVar10 = local_630[lVar14];
        uVar35 = -uVar10;
        if (0 < (int)uVar10) {
          uVar35 = uVar10;
        }
        uVar10 = ptVar44[lVar14];
        uVar46 = -uVar10;
        if (0 < (int)uVar10) {
          uVar46 = uVar10;
        }
        iVar38 = (int)(uVar41 + (long)nz_map_ctx_offset_1d[(int)sVar1 & uVar45]);
        uVar41 = 3;
        if (uVar11 < 3) {
          uVar41 = (ulong)uVar11;
        }
        if (uVar11 < 4) {
          iVar32 = (*(int (*) [8])((long)local_710 + (long)iVar38 * 0x20))[(ulong)uVar11 + 4];
          iVar23 = (*(int (*) [8])((long)local_710 + (long)iVar38 * 0x20))[uVar41] + 0x200;
          if (uVar11 == 3) goto LAB_00371576;
        }
        else {
          iVar32 = 0;
LAB_00371576:
          iVar23 = iVar22 << ((byte)uVar31 & 0x1f);
          iVar22 = iVar22 * (int)local_700 + (sVar1 - iVar23);
          uVar10 = (uint)levels_buf[(long)iVar22 + 2] +
                   (uint)levels_buf[(int)local_700 + iVar22] + (uint)levels_buf[(long)iVar22 + 1] +
                   1 >> 1;
          if (5 < uVar10) {
            uVar10 = 6;
          }
          if (sVar1 != 0) {
            if (sVar1 == iVar23) {
              uVar10 = uVar10 + 7;
            }
            else {
              uVar10 = uVar10 + 0xe;
            }
          }
          uVar19 = 0xf;
          if (uVar11 < 0xf) {
            uVar19 = uVar11;
          }
          if (uVar11 < 0x10) {
            iVar22 = local_728[uVar10][(ulong)uVar19 + 10];
            uVar33 = 0;
            uVar40 = 1;
            if (uVar11 == 0xf) {
LAB_0037161a:
              uVar33 = golomb_bits_cost[uVar40];
              local_6a0 = CONCAT44(local_6a0._4_4_,local_72c);
              iVar22 = iVar22 + golomb_cost_diff[uVar40];
            }
          }
          else {
            uVar40 = uVar11 - 0xe;
            iVar22 = 0;
            if (uVar11 < 0x2e) goto LAB_0037161a;
            uVar33 = 0x1f;
            if (uVar40 != 0) {
              for (; uVar40 >> uVar33 == 0; uVar33 = uVar33 - 1) {
              }
            }
            uVar33 = (uVar33 ^ 0x1f) << 10 ^ 0x7e00;
            local_6a0 = CONCAT44(local_6a0._4_4_,uVar11 - 0xf);
            iVar22 = (uint)((uVar11 - 0xf & uVar40) == 0) << 10;
          }
          iVar32 = iVar32 + iVar22;
          iVar23 = uVar33 + (*(int (*) [8])((long)local_710 + (long)iVar38 * 0x20))[uVar41] + 0x200
                   + local_728[(ulong)uVar10 - 1][(ulong)uVar19 + 0x17];
          uVar31 = local_6d0;
          ptVar44 = local_6e8;
        }
        scan = local_650;
        if (uVar35 < uVar46 || uVar35 - uVar46 == 0) {
          lVar42 = (long)(int)(uVar35 - uVar46 << (bVar5 & 0x1f));
          if (local_688 == (qm_val_t *)0x0) {
            uVar41 = lVar42 * lVar42;
          }
          else {
            uVar41 = (ulong)local_688[lVar14] * lVar42 * (ulong)local_688[lVar14] * lVar42 + 0x200
                     >> 10;
          }
          uVar10 = uVar11 - 1;
          uVar46 = (int)(iVar18 * uVar10) >> (bVar5 & 0x1f);
          lVar42 = (long)(int)(uVar35 - uVar46 << (bVar5 & 0x1f));
          if (local_688 == (qm_val_t *)0x0) {
            uVar28 = lVar42 * lVar42;
          }
          else {
            uVar28 = (ulong)local_688[lVar14] * lVar42 * (ulong)local_688[lVar14] * lVar42 + 0x200
                     >> 10;
          }
          if ((sharpness == 0 || 1 < uVar11) &&
             ((long)(uVar28 * 0x80 + ((iVar23 - iVar32) * local_6e0 + 0x100 >> 9)) <
              (long)(uVar41 * 0x80 + (iVar23 * local_6e0 + 0x100 >> 9)))) {
            uVar9 = (int)uVar9 >> 0x1f;
            local_6f8[lVar14] = (uVar10 ^ uVar9) + -uVar9;
            ptVar44[lVar14] = (uVar46 ^ uVar9) + -uVar9;
            if (0x7e < uVar10) {
              uVar10 = 0x7f;
            }
            *local_720 = (uint8_t)uVar10;
            iVar23 = iVar23 - iVar32;
          }
        }
      }
      iVar18 = (int)uVar31;
      local_72c = local_72c + iVar23;
      lVar24 = lVar24 + -1;
      uVar9 = (int)puVar13 - 1;
      puVar13 = (uint8_t *)(ulong)uVar9;
      iqmatrix = local_6b8;
      uVar37 = local_6c0;
      qcoeff = local_6f8;
    } while (1 < lVar24);
  }
  if (uVar9 == 0) {
    dummy_dist = 0;
    update_coeff_general
              ((int *)&local_72c,&dummy_dist,0,(int)local_6b0,tx_size,(TX_CLASS)local_620,iVar18,
               (int)local_648,local_6e0,(int)uVar37,txb_ctx->dc_sign_ctx,local_600,scan,local_6c8,
               local_630,qcoeff,local_6e8,levels_buf,iqmatrix,local_688);
  }
  uVar41 = local_6b0;
  uVar9 = (uint)local_6b0;
  if (uVar9 != 0) {
    iVar12 = get_tx_type_cost(x,local_698,local_61c,tx_size,tx_type_00,
                              (uint)(cpi->common).features.reduced_tx_set_used);
    iVar12 = iVar12 + iVar8;
  }
  iVar12 = iVar12 + local_72c;
  x->plane[plane].eobs[block] = (uint16_t)uVar41;
  uVar6 = av1_get_txb_entropy_context
                    (local_6f8,(SCAN_ORDER *)((long)&av1_scan_orders[0][0].scan + uVar20 + uVar7),
                     uVar9 & 0xffff);
  x->plane[plane].txb_entropy_ctx[block] = uVar6;
  *rate_cost = iVar12;
  return uVar9;
}

Assistant:

int av1_optimize_txb(const struct AV1_COMP *cpi, MACROBLOCK *x, int plane,
                     int block, TX_SIZE tx_size, TX_TYPE tx_type,
                     const TXB_CTX *const txb_ctx, int *rate_cost,
                     int sharpness) {
  MACROBLOCKD *xd = &x->e_mbd;
  const struct macroblock_plane *p = &x->plane[plane];
  const SCAN_ORDER *scan_order = get_scan(tx_size, tx_type);
  const int16_t *scan = scan_order->scan;
  const int shift = av1_get_tx_scale(tx_size);
  int eob = p->eobs[block];
  const int16_t *dequant = p->dequant_QTX;
  const qm_val_t *iqmatrix =
      av1_get_iqmatrix(&cpi->common.quant_params, xd, plane, tx_size, tx_type);
  const qm_val_t *qmatrix =
      cpi->oxcf.tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR
          ? av1_get_qmatrix(&cpi->common.quant_params, xd, plane, tx_size,
                            tx_type)
          : NULL;
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *qcoeff = p->qcoeff + block_offset;
  tran_low_t *dqcoeff = p->dqcoeff + block_offset;
  const tran_low_t *tcoeff = p->coeff + block_offset;
  const CoeffCosts *coeff_costs = &x->coeff_costs;

  // This function is not called if eob = 0.
  assert(eob > 0);

  const AV1_COMMON *cm = &cpi->common;
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  const TX_CLASS tx_class = tx_type_to_class[tx_type];
  const MB_MODE_INFO *mbmi = xd->mi[0];
  const int bhl = get_txb_bhl(tx_size);
  const int width = get_txb_wide(tx_size);
  const int height = get_txb_high(tx_size);
  assert(height == (1 << bhl));
  const int is_inter = is_inter_block(mbmi);
  const LV_MAP_COEFF_COST *txb_costs =
      &coeff_costs->coeff_costs[txs_ctx][plane_type];
  const int eob_multi_size = txsize_log2_minus4[tx_size];
  const LV_MAP_EOB_COST *txb_eob_costs =
      &coeff_costs->eob_costs[eob_multi_size][plane_type];

  // For the IQ and SSIMULACRA 2 tunings, increase rshift from 2 to 4.
  // This biases trellis quantization towards keeping more coefficients, and
  // together with the IQ and SSIMULACRA2 rdmult adjustment in
  // av1_compute_rd_mult_based_on_qindex(), this helps preserve image
  // features (like repeating patterns and camera noise/film grain), which
  // improves SSIMULACRA 2 scores.
  const int rshift = (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_IQ ||
                      cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIMULACRA2)
                         ? 7
                         : 5;

  const int64_t rdmult = ROUND_POWER_OF_TWO(
      (int64_t)x->rdmult * (8 - sharpness) *
          (plane_rd_mult[is_inter][plane_type] << (2 * (xd->bd - 8))),
      rshift);

  uint8_t levels_buf[TX_PAD_2D];
  uint8_t *const levels = set_levels(levels_buf, height);

  if (eob > 1) av1_txb_init_levels(qcoeff, width, height, levels);

  // TODO(angirbird): check iqmatrix

  const int non_skip_cost = txb_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][0];
  const int skip_cost = txb_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  const int eob_cost = get_eob_cost(eob, txb_eob_costs, txb_costs, tx_class);
  int accu_rate = eob_cost;
  int64_t accu_dist = 0;
  int si = eob - 1;
  const int ci = scan[si];
  const tran_low_t qc = qcoeff[ci];
  const tran_low_t abs_qc = abs(qc);
  const int sign = qc < 0;
  const int max_nz_num = 2;
  int nz_num = 1;
  int nz_ci[3] = { ci, 0, 0 };
  if (abs_qc >= 2) {
    update_coeff_general(&accu_rate, &accu_dist, si, eob, tx_size, tx_class,
                         bhl, width, rdmult, shift, txb_ctx->dc_sign_ctx,
                         dequant, scan, txb_costs, tcoeff, qcoeff, dqcoeff,
                         levels, iqmatrix, qmatrix);
    --si;
  } else {
    assert(abs_qc == 1);
    const int coeff_ctx = get_lower_levels_ctx_eob(bhl, width, si);
    accu_rate +=
        get_coeff_cost_eob(ci, abs_qc, sign, coeff_ctx, txb_ctx->dc_sign_ctx,
                           txb_costs, bhl, tx_class);
    const tran_low_t tqc = tcoeff[ci];
    const tran_low_t dqc = dqcoeff[ci];
    const int64_t dist = get_coeff_dist(tqc, dqc, shift, qmatrix, ci);
    const int64_t dist0 = get_coeff_dist(tqc, 0, shift, qmatrix, ci);
    accu_dist += dist - dist0;
    --si;
  }

#define UPDATE_COEFF_EOB_CASE(tx_class_literal)                            \
  case tx_class_literal:                                                   \
    for (; si >= 0 && nz_num <= max_nz_num; --si) {                        \
      update_coeff_eob(&accu_rate, &accu_dist, &eob, &nz_num, nz_ci, si,   \
                       tx_size, tx_class_literal, bhl, width,              \
                       txb_ctx->dc_sign_ctx, rdmult, shift, dequant, scan, \
                       txb_eob_costs, txb_costs, tcoeff, qcoeff, dqcoeff,  \
                       levels, sharpness, iqmatrix, qmatrix);              \
    }                                                                      \
    break
  switch (tx_class) {
    UPDATE_COEFF_EOB_CASE(TX_CLASS_2D);
    UPDATE_COEFF_EOB_CASE(TX_CLASS_HORIZ);
    UPDATE_COEFF_EOB_CASE(TX_CLASS_VERT);
#undef UPDATE_COEFF_EOB_CASE
    default: assert(false);
  }

  if (si == -1 && nz_num <= max_nz_num && sharpness == 0) {
    update_skip(&accu_rate, accu_dist, &eob, nz_num, nz_ci, rdmult, skip_cost,
                non_skip_cost, qcoeff, dqcoeff);
  }

#define UPDATE_COEFF_SIMPLE_CASE(tx_class_literal)                             \
  case tx_class_literal:                                                       \
    for (; si >= 1; --si) {                                                    \
      update_coeff_simple(&accu_rate, si, eob, tx_size, tx_class_literal, bhl, \
                          rdmult, shift, dequant, scan, txb_costs, tcoeff,     \
                          qcoeff, dqcoeff, levels, sharpness, iqmatrix,        \
                          qmatrix);                                            \
    }                                                                          \
    break
  switch (tx_class) {
    UPDATE_COEFF_SIMPLE_CASE(TX_CLASS_2D);
    UPDATE_COEFF_SIMPLE_CASE(TX_CLASS_HORIZ);
    UPDATE_COEFF_SIMPLE_CASE(TX_CLASS_VERT);
#undef UPDATE_COEFF_SIMPLE_CASE
    default: assert(false);
  }

  // DC position
  if (si == 0) {
    // no need to update accu_dist because it's not used after this point
    int64_t dummy_dist = 0;
    update_coeff_general(&accu_rate, &dummy_dist, si, eob, tx_size, tx_class,
                         bhl, width, rdmult, shift, txb_ctx->dc_sign_ctx,
                         dequant, scan, txb_costs, tcoeff, qcoeff, dqcoeff,
                         levels, iqmatrix, qmatrix);
  }

  const int tx_type_cost = get_tx_type_cost(x, xd, plane, tx_size, tx_type,
                                            cm->features.reduced_tx_set_used);
  if (eob == 0)
    accu_rate += skip_cost;
  else
    accu_rate += non_skip_cost + tx_type_cost;

  p->eobs[block] = eob;
  p->txb_entropy_ctx[block] =
      av1_get_txb_entropy_context(qcoeff, scan_order, p->eobs[block]);

  *rate_cost = accu_rate;
  return eob;
}